

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

int Gia_MiniAigSuperPreprocess(Mini_Aig_t *p,Vec_Wec_t *vSuper,int nPis,int fVerbose)

{
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (vSuper->nSize < 1) {
    uVar3 = 1;
  }
  else {
    uVar3 = 1;
    uVar4 = 0;
    do {
      pVVar1 = vSuper->pArray;
      p_00 = pVVar1 + uVar4;
      qsort(pVVar1[uVar4].pArray,(long)pVVar1[uVar4].nSize,4,Vec_IntSortCompare1);
      if (fVerbose != 0) {
        printf("\nOutput %d\n",uVar4 & 0xffffffff);
        Gia_MiniAigSuperPrintDouble(p_00,nPis);
      }
      iVar2 = Gia_MiniAigSuperMerge(p_00,nPis);
      uVar5 = 1;
      while (iVar2 != 0) {
        if (fVerbose != 0) {
          Gia_MiniAigSuperPrintDouble(p_00,nPis);
        }
        uVar5 = uVar5 + 1;
        iVar2 = Gia_MiniAigSuperMerge(p_00,nPis);
      }
      if ((int)uVar3 <= (int)uVar5) {
        uVar3 = uVar5;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)vSuper->nSize);
  }
  if (fVerbose != 0) {
    printf("Multi = %d.\n",(ulong)uVar3);
  }
  return uVar3;
}

Assistant:

int Gia_MiniAigSuperPreprocess( Mini_Aig_t * p, Vec_Wec_t * vSuper, int nPis, int fVerbose )
{
    Vec_Int_t * vRes;
    int i, nIters, Multi = 1;
    Vec_WecForEachLevel( vSuper, vRes, i )
    {
        Vec_IntSort( vRes, 0 );
        if ( fVerbose ) 
            printf( "\nOutput %d\n", i );
        if ( fVerbose )
            Gia_MiniAigSuperPrintDouble( vRes, nPis );
        for ( nIters = 1; Gia_MiniAigSuperMerge(vRes, nPis); nIters++ )
        {
            if ( fVerbose )
                Gia_MiniAigSuperPrintDouble( vRes, nPis );
        }
        Multi = Abc_MaxInt( Multi, nIters );
    }
    if ( fVerbose )
        printf( "Multi = %d.\n", Multi );
    return Multi;
}